

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::set_text_in_range(TextBuffer *this,Range old_range,u16string *string)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Layer *pLVar4;
  Point PVar5;
  Change *pCVar6;
  ClipResult CVar7;
  Point local_220;
  Point local_218;
  Point local_210;
  anon_class_16_2_1908bdce local_208;
  Point local_1f8;
  Point local_1f0;
  const_iterator local_1e8;
  const_iterator new_text_iter;
  bool change_is_noop;
  undefined1 local_1d0 [8];
  optional<Patch::Change> change;
  optional<Text> local_148;
  Point local_108;
  Point local_100;
  Point local_f8;
  Point local_ec;
  Point local_e4;
  uint local_dc;
  Point PStack_d8;
  uint32_t deleted_text_size;
  Point local_d0;
  Point new_range_end;
  Point inserted_extent;
  Text new_text;
  Point deleted_extent;
  uint32_t local_78;
  Point local_64;
  ClipResult end;
  uint32_t local_50;
  Point local_40;
  ClipResult start;
  u16string *string_local;
  TextBuffer *this_local;
  Range old_range_local;
  
  old_range_local.start = old_range.end;
  this_local = (TextBuffer *)old_range.start;
  if ((this->top_layer == this->base_layer) || (this->top_layer->snapshot_count != 0)) {
    pLVar4 = (Layer *)operator_new(0xa0);
    Layer::Layer(pLVar4,this->top_layer);
    this->top_layer = pLVar4;
  }
  CVar7 = clip_position(this,(Point)this_local);
  end._4_8_ = CVar7.position;
  local_40.row = end.position.column;
  local_40.column = end.offset;
  local_50 = CVar7.offset;
  start.position.row = local_50;
  unique0x10000497 = CVar7;
  bVar1 = Point::operator==(&old_range_local.start,(Point *)&this_local);
  if (bVar1) {
    local_64 = local_40;
    end.position.row = start.position.row;
  }
  else {
    CVar7 = clip_position(this,old_range_local.start);
    deleted_extent = CVar7.position;
    local_64 = deleted_extent;
    local_78 = CVar7.offset;
    end.position.row = local_78;
  }
  PVar5 = Point::traversal(&local_64,&local_40);
  Text::Text((Text *)&inserted_extent,string);
  new_range_end = Text::extent((Text *)&inserted_extent);
  PStack_d8 = Text::extent((Text *)&inserted_extent);
  local_d0 = Point::traverse(&local_40,&stack0xffffffffffffff28);
  local_dc = end.position.row - start.position.row;
  local_ec = Point::traversal(&this->top_layer->extent_,&local_64);
  local_e4 = Point::traverse(&local_d0,&local_ec);
  this->top_layer->extent_ = local_e4;
  uVar2 = Text::size((Text *)&inserted_extent);
  this->top_layer->size_ = this->top_layer->size_ + (uVar2 - local_dc);
  pLVar4 = this->top_layer;
  local_f8 = local_40;
  local_108 = new_range_end;
  local_100 = PVar5;
  optional<Text>::optional(&local_148);
  optional<Text>::optional((optional<Text> *)&change.is_some,(Text *)&inserted_extent);
  Patch::splice(&pLVar4->patch,local_f8.row,(__off64_t *)local_100,local_108.row,
                (__off64_t *)&local_148,(size_t)&change.is_some,local_dc);
  optional<Text>::~optional((optional<Text> *)&change.is_some);
  optional<Text>::~optional(&local_148);
  Patch::grab_change_starting_before_new_position
            ((optional<Patch::Change> *)local_1d0,&this->top_layer->patch,local_40);
  bVar1 = ::optional::operator_cast_to_bool((optional *)local_1d0);
  if (bVar1) {
    pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
    uVar2 = pCVar6->old_text_size;
    pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
    uVar3 = Text::size(pCVar6->new_text);
    if (uVar2 == uVar3) {
      new_text_iter._M_current._7_1_ = 1;
      pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
      local_1e8 = Text::begin_abi_cxx11_(pCVar6->new_text);
      pLVar4 = this->top_layer->previous_layer;
      pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
      local_1f0 = pCVar6->old_start;
      pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
      local_1f8 = pCVar6->old_end;
      local_208.change_is_noop = (bool *)((long)&new_text_iter._M_current + 7);
      local_208.new_text_iter = &local_1e8;
      Layer::
      for_each_chunk_in_range<TextBuffer::set_text_in_range(Range,std::__cxx11::u16string&&)::__0>
                (pLVar4,local_1f0,local_1f8,&local_208,false);
      if ((new_text_iter._M_current._7_1_ & 1) != 0) {
        pLVar4 = this->top_layer;
        pCVar6 = optional<Patch::Change>::operator->((optional<Patch::Change> *)local_1d0);
        local_210 = pCVar6->old_start;
        Point::Point(&local_218);
        Point::Point(&local_220);
        Patch::splice_old(&pLVar4->patch,local_210,local_218,local_220);
      }
    }
  }
  Text::~Text((Text *)&inserted_extent);
  return;
}

Assistant:

void TextBuffer::set_text_in_range(Range old_range, u16string &&string) {
  if (top_layer == base_layer || top_layer->snapshot_count > 0) {
    top_layer = new Layer(top_layer);
  }

  auto start = clip_position(old_range.start);
  auto end = old_range.end == old_range.start ? start : clip_position(old_range.end);
  Point deleted_extent = end.position.traversal(start.position);
  Text new_text{move(string)};
  Point inserted_extent = new_text.extent();
  Point new_range_end = start.position.traverse(new_text.extent());
  uint32_t deleted_text_size = end.offset - start.offset;
  top_layer->extent_ = new_range_end.traverse(top_layer->extent_.traversal(end.position));
  top_layer->size_ += new_text.size() - deleted_text_size;
  top_layer->patch.splice(
    start.position,
    deleted_extent,
    inserted_extent,
    optional<Text>{},
    move(new_text),
    deleted_text_size
  );

  auto change = top_layer->patch.grab_change_starting_before_new_position(start.position);
  if (change && change->old_text_size == change->new_text->size()) {
    bool change_is_noop = true;
    auto new_text_iter = change->new_text->begin();
    top_layer->previous_layer->for_each_chunk_in_range(
      change->old_start,
      change->old_end,
      [&change_is_noop, &new_text_iter](TextSlice chunk) {
        auto new_text_end = new_text_iter + chunk.size();
        if (!std::equal(new_text_iter, new_text_end, chunk.begin())) {
          change_is_noop = false;
          return true;
        }
        new_text_iter = new_text_end;
        return false;
      });
    if (change_is_noop) {
      top_layer->patch.splice_old(change->old_start, Point(), Point());
    }
  }
}